

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,ResultType *rt)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  TypeVector *types;
  string local_50;
  Type local_30;
  string_view local_28;
  ResultType *local_18;
  ResultType *rt_local;
  CWriter *this_local;
  
  local_18 = rt;
  rt_local = (ResultType *)this;
  bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty(rt->types);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"void");
    Write(this,local_28);
  }
  else {
    sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(local_18->types);
    if (sVar2 == 1) {
      pvVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[](local_18->types,0);
      local_30.enum_ = pvVar3->enum_;
      local_30.type_index_ = pvVar3->type_index_;
      Write(this,local_30);
    }
    else {
      (anonymous_namespace)::CWriter::MangleMultivalueTypes_abi_cxx11_
                (&local_50,(CWriter *)local_18->types,types);
      (anonymous_namespace)::CWriter::Write<char_const(&)[8],std::__cxx11::string>
                ((CWriter *)this,(char (*) [8])0x36198b,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void CWriter::Write(const ResultType& rt) {
  if (rt.types.empty()) {
    Write("void");
  } else if (rt.types.size() == 1) {
    Write(rt.types[0]);
  } else {
    Write("struct ", MangleMultivalueTypes(rt.types));
  }
}